

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

void Aig_ManSuppCharAdd(uint *pBuffer,Vec_Int_t *vOne,int nPis)

{
  int iVar1;
  int local_20;
  int Entry;
  int i;
  int nPis_local;
  Vec_Int_t *vOne_local;
  uint *pBuffer_local;
  
  local_20 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vOne);
    if (iVar1 <= local_20) {
      return;
    }
    iVar1 = Vec_IntEntry(vOne,local_20);
    if (nPis <= iVar1) break;
    Abc_InfoSetBit(pBuffer,iVar1);
    local_20 = local_20 + 1;
  }
  __assert_fail("Entry < nPis",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                ,0x1f5,"void Aig_ManSuppCharAdd(unsigned int *, Vec_Int_t *, int)");
}

Assistant:

void Aig_ManSuppCharAdd( unsigned * pBuffer, Vec_Int_t * vOne, int nPis )
{
    int i, Entry;
    Vec_IntForEachEntry( vOne, Entry, i )
    {
        assert( Entry < nPis );
        Abc_InfoSetBit( pBuffer, Entry );
    }
}